

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O2

double __thiscall
VarianceSwapsHestonAnalyticalPricer::uiTerm
          (VarianceSwapsHestonAnalyticalPricer *this,double t1,double t2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  complex<double> D1;
  complex<double> C1;
  double local_d8;
  double dStack_d0;
  double local_48;
  double dStack_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  dVar4 = t2 - t1;
  dVar1 = qtildeTerm(this);
  dVar2 = wTerm(this,t1);
  dVar3 = cTerm(this,t1);
  dVar5 = 0.0;
  functionCPrime(this,dVar4,0.0);
  local_28._8_8_ = dVar5;
  functionCSecond(this,dVar4,0.0);
  dVar6 = 0.0;
  functionDPrime(this,dVar4,0.0);
  local_38._8_8_ = dVar6;
  functionDSecond(this,dVar4,0.0);
  dVar4 = dVar1 + dVar2;
  dStack_40 = dVar4 * dVar4 + dVar2 + dVar2 + dVar1;
  local_48 = extraout_XMM0_Qa_01 * dStack_40;
  dStack_40 = dVar6 * dStack_40;
  std::operator*((complex<double> *)&local_48,(complex<double> *)local_38);
  local_48 = extraout_XMM0_Qa + extraout_XMM0_Qa;
  dStack_40 = dVar5 + dVar5;
  std::operator*((complex<double> *)&local_48,(complex<double> *)local_38);
  auVar7._8_8_ = (extraout_XMM0_Qa_04 - extraout_XMM0_Qa_02) * dVar4;
  auVar7._0_8_ = extraout_XMM0_Qa_03;
  auVar8._8_8_ = dVar3;
  auVar8._0_8_ = dVar3 * dVar3;
  auVar8 = divpd(auVar7,auVar8);
  std::operator*((complex<double> *)local_28,(complex<double> *)local_28);
  local_d8 = auVar8._0_8_;
  dStack_d0 = auVar8._8_8_;
  return (extraout_XMM0_Qa_05 - extraout_XMM0_Qa_00) + dStack_d0 + local_d8;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::
uiTerm(double t1, double t2) const {
    double delta = t2-t1,
           qtilde = qtildeTerm(),
           Wi = wTerm(t1),
           ci = cTerm(t1);
    std::complex<double> C1 = functionCPrime(delta,0.),
           C2 = functionCSecond(delta,0.),
           D1 = functionDPrime(delta,0.),
           D2 = functionDSecond(delta,0.);
    std::complex<double> firstTerm = (qtilde+2*Wi+(qtilde + Wi)*(qtilde + Wi)) 
                                        *D1*D1/(ci*ci),
                        secondTerm = (qtilde+Wi)*(2.0*C1*D1 - D2) / ci,
                        thirdTerm= C1*C1 - C2;
    std::complex<double> ui = firstTerm+secondTerm+thirdTerm;
    return ui.real();
}